

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::InternalSwap
          (NearestNeighborsIndex *this,NearestNeighborsIndex *other)

{
  NearestNeighborsIndex *other_local;
  NearestNeighborsIndex *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->floatsamples_).super_RepeatedPtrFieldBase,
             &(other->floatsamples_).super_RepeatedPtrFieldBase);
  std::swap<int>(&this->numberofdimensions_,&other->numberofdimensions_);
  std::swap<CoreML::Specification::NearestNeighborsIndex::IndexTypeUnion>
            (&this->IndexType_,&other->IndexType_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<CoreML::Specification::NearestNeighborsIndex::DistanceFunctionUnion>
            (&this->DistanceFunction_,&other->DistanceFunction_);
  std::swap<unsigned_int>(this->_oneof_case_ + 1,other->_oneof_case_ + 1);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void NearestNeighborsIndex::InternalSwap(NearestNeighborsIndex* other) {
  floatsamples_.InternalSwap(&other->floatsamples_);
  std::swap(numberofdimensions_, other->numberofdimensions_);
  std::swap(IndexType_, other->IndexType_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(DistanceFunction_, other->DistanceFunction_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}